

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<bssl::(anonymous_namespace)::ParseCrlDistributionPointsTest_NoDistributionPointName_Test>
::CreateTest(TestFactoryImpl<bssl::(anonymous_namespace)::ParseCrlDistributionPointsTest_NoDistributionPointName_Test>
             *this)

{
  ParseCrlDistributionPointsTest *this_00;
  
  this_00 = (ParseCrlDistributionPointsTest *)operator_new(0x28);
  bssl::anon_unknown_0::ParseCrlDistributionPointsTest::ParseCrlDistributionPointsTest(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__ParseCrlDistributionPointsTest_00599a08;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }